

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Eigenvalue.hpp
# Opt level: O1

void __thiscall JAMA::Eigenvalue<double>::orthes(Eigenvalue<double> *this)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  double **ppdVar4;
  double *pdVar5;
  pointer pdVar6;
  pointer pdVar7;
  double **ppdVar8;
  long lVar9;
  bool bVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  uint uVar17;
  double **ppdVar18;
  pointer pdVar19;
  ulong uVar20;
  pointer pdVar21;
  long lVar22;
  ulong uVar23;
  ulong uVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  double dVar30;
  undefined1 auVar31 [16];
  double dVar32;
  
  iVar1 = this->n;
  uVar16 = (ulong)iVar1;
  uVar17 = iVar1 - 1;
  if (2 < (long)uVar16) {
    uVar13 = uVar16 - 1;
    uVar23 = 1;
    lVar22 = 0;
    uVar24 = uVar16;
    do {
      dVar30 = 0.0;
      if (uVar23 < uVar16) {
        uVar14 = 1;
        do {
          dVar30 = dVar30 + ABS(*(double *)
                                 (*(long *)((long)(this->H).data_ + uVar14 * 8 + lVar22) + -8 +
                                 uVar23 * 8));
          uVar14 = uVar14 + 1;
        } while (uVar24 != uVar14);
      }
      if ((dVar30 != 0.0) || (NAN(dVar30))) {
        dVar32 = 0.0;
        dVar25 = 0.0;
        if (uVar23 < uVar16) {
          ppdVar4 = (this->H).data_;
          pdVar21 = (this->ort).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start;
          uVar14 = uVar13;
          do {
            dVar25 = ppdVar4[uVar14 & 0xffffffff][uVar23 - 1] / dVar30;
            pdVar21[uVar14] = dVar25;
            dVar32 = dVar32 + dVar25 * dVar25;
            bVar10 = (long)uVar23 < (long)uVar14;
            uVar14 = uVar14 - 1;
            dVar25 = dVar32;
          } while (bVar10);
        }
        if (dVar25 < 0.0) {
          dVar32 = sqrt(dVar25);
        }
        else {
          dVar32 = SQRT(dVar25);
        }
        pdVar21 = (this->ort).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
        dVar27 = pdVar21[uVar23];
        dVar32 = (double)(~-(ulong)(0.0 < dVar27) & (ulong)dVar32 |
                         (ulong)-dVar32 & -(ulong)(0.0 < dVar27));
        dVar25 = dVar25 - dVar27 * dVar32;
        pdVar21[uVar23] = dVar27 - dVar32;
        uVar2 = this->n;
        if ((long)uVar23 < (long)(int)uVar2) {
          ppdVar4 = (this->H).data_;
          uVar14 = uVar23;
          do {
            dVar26 = 0.0;
            uVar20 = uVar13;
            dVar27 = 0.0;
            if (uVar23 < uVar16) {
              do {
                dVar26 = dVar26 + pdVar21[uVar20] * ppdVar4[uVar20 & 0xffffffff][uVar14];
                bVar10 = (long)uVar23 < (long)uVar20;
                uVar20 = uVar20 - 1;
                dVar27 = dVar26;
              } while (bVar10);
            }
            if (uVar23 < uVar16) {
              uVar20 = 1;
              do {
                lVar15 = *(long *)((long)ppdVar4 + uVar20 * 8 + lVar22);
                *(double *)(lVar15 + uVar14 * 8) =
                     *(double *)((long)pdVar21 + uVar20 * 8 + lVar22) * (-dVar27 / dVar25) +
                     *(double *)(lVar15 + uVar14 * 8);
                uVar20 = uVar20 + 1;
              } while (uVar24 != uVar20);
            }
            uVar14 = uVar14 + 1;
          } while (uVar14 != uVar2);
        }
        ppdVar4 = (this->H).data_;
        uVar14 = 0;
        do {
          dVar27 = 0.0;
          if (uVar23 < uVar16) {
            uVar20 = uVar13;
            do {
              dVar27 = dVar27 + pdVar21[uVar20] * ppdVar4[uVar14][uVar20 & 0xffffffff];
              bVar10 = (long)uVar23 < (long)uVar20;
              uVar20 = uVar20 - 1;
            } while (bVar10);
          }
          if (uVar23 < uVar16) {
            pdVar5 = ppdVar4[uVar14];
            uVar20 = 1;
            do {
              *(double *)((long)pdVar5 + uVar20 * 8 + lVar22) =
                   *(double *)((long)pdVar21 + uVar20 * 8 + lVar22) * (-dVar27 / dVar25) +
                   *(double *)((long)pdVar5 + uVar20 * 8 + lVar22);
              uVar20 = uVar20 + 1;
            } while (uVar24 != uVar20);
          }
          uVar14 = uVar14 + 1;
        } while (uVar14 != uVar16);
        pdVar21[uVar23] = pdVar21[uVar23] * dVar30;
        (this->H).data_[uVar23][uVar23 - 1] = dVar32 * dVar30;
      }
      uVar23 = uVar23 + 1;
      lVar22 = lVar22 + 8;
      uVar24 = uVar24 - 1;
    } while (uVar23 != uVar17);
  }
  auVar12 = _DAT_00291570;
  auVar11 = _DAT_00291560;
  iVar3 = this->n;
  uVar13 = (ulong)iVar3;
  if (0 < (long)uVar13) {
    ppdVar4 = (this->V).data_;
    lVar22 = uVar13 - 1;
    auVar28._8_4_ = (int)lVar22;
    auVar28._0_8_ = lVar22;
    auVar28._12_4_ = (int)((ulong)lVar22 >> 0x20);
    uVar24 = 0;
    auVar28 = auVar28 ^ _DAT_00291570;
    do {
      pdVar5 = ppdVar4[uVar24];
      uVar23 = 0;
      auVar29 = auVar11;
      do {
        auVar31 = auVar29 ^ auVar12;
        if ((bool)(~(auVar31._4_4_ == auVar28._4_4_ && auVar28._0_4_ < auVar31._0_4_ ||
                    auVar28._4_4_ < auVar31._4_4_) & 1)) {
          dVar30 = 1.0;
          if (uVar24 != uVar23) {
            dVar30 = 0.0;
          }
          pdVar5[uVar23] = dVar30;
        }
        if ((auVar31._12_4_ != auVar28._12_4_ || auVar31._8_4_ <= auVar28._8_4_) &&
            auVar31._12_4_ <= auVar28._12_4_) {
          dVar30 = 1.0;
          if (uVar24 - 1 != uVar23) {
            dVar30 = 0.0;
          }
          pdVar5[uVar23 + 1] = dVar30;
        }
        uVar23 = uVar23 + 2;
        lVar22 = auVar29._8_8_;
        auVar29._0_8_ = auVar29._0_8_ + 2;
        auVar29._8_8_ = lVar22 + 2;
      } while ((iVar3 + 1U & 0xfffffffe) != uVar23);
      uVar24 = uVar24 + 1;
    } while (uVar24 != uVar13);
  }
  if (2 < iVar1) {
    ppdVar4 = (this->H).data_;
    pdVar6 = (this->ort).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar13 = (ulong)(iVar1 - 2);
    lVar22 = uVar13 * 8;
    ppdVar18 = ppdVar4 + uVar13 + 1;
    pdVar19 = pdVar6 + uVar13 + 1;
    pdVar21 = pdVar6 + uVar13;
    do {
      uVar24 = uVar13 - 1;
      pdVar5 = ppdVar4[uVar13];
      dVar30 = pdVar5[uVar13 - 1];
      if ((dVar30 != 0.0) || (NAN(dVar30))) {
        iVar3 = (int)uVar13;
        if ((long)uVar13 < (long)(int)uVar17) {
          lVar15 = 0;
          do {
            pdVar19[lVar15] = ppdVar18[lVar15][uVar24];
            lVar15 = lVar15 + 1;
          } while (iVar3 + (int)lVar15 < (int)uVar17);
        }
        if ((long)uVar13 < (long)uVar16) {
          pdVar7 = (this->ort).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          ppdVar8 = (this->V).data_;
          uVar23 = uVar13;
          do {
            dVar30 = 0.0;
            lVar15 = 0;
            do {
              dVar30 = dVar30 + *(double *)((long)pdVar7 + lVar15 * 8 + lVar22) *
                                *(double *)
                                 (*(long *)((long)ppdVar8 + lVar15 * 8 + lVar22) + uVar23 * 8);
              lVar15 = lVar15 + 1;
            } while ((int)lVar15 + iVar3 < iVar1);
            dVar25 = pdVar6[uVar13];
            dVar32 = pdVar5[uVar24];
            lVar15 = 0;
            do {
              lVar9 = *(long *)((long)ppdVar8 + lVar15 * 8 + lVar22);
              *(double *)(lVar9 + uVar23 * 8) =
                   pdVar21[lVar15] * ((dVar30 / dVar25) / dVar32) + *(double *)(lVar9 + uVar23 * 8);
              lVar15 = lVar15 + 1;
            } while ((int)lVar15 + iVar3 < iVar1);
            uVar23 = uVar23 + 1;
          } while ((int)uVar23 < iVar1);
        }
      }
      ppdVar18 = ppdVar18 + -1;
      pdVar19 = pdVar19 + -1;
      lVar22 = lVar22 + -8;
      pdVar21 = pdVar21 + -1;
      bVar10 = 1 < (long)uVar13;
      uVar13 = uVar24;
    } while (bVar10);
  }
  return;
}

Assistant:

void orthes() {
      //  This is derived from the Algol procedures orthes and ortran,
      //  by Martin and Wilkinson, Handbook for Auto. Comp.,
      //  Vol.ii-Linear Algebra, and the corresponding
      //  Fortran subroutines in EISPACK.

      int low  = 0;
      int high = n - 1;

      for (int m = low + 1; m <= high - 1; m++) {
        // Scale column.

        Real scale = 0.0;
        for (int i = m; i <= high; i++) {
          scale = scale + abs(H(i, m - 1));
        }
        if (scale != 0.0) {
          // Compute Householder transformation.

          Real h = 0.0;
          for (int i = high; i >= m; i--) {
            ort(i) = H(i, m - 1) / scale;
            h += ort(i) * ort(i);
          }
          Real g = sqrt(h);
          if (ort(m) > 0) { g = -g; }
          h      = h - ort(m) * g;
          ort(m) = ort(m) - g;

          // Apply Householder similarity transformation
          // H = (I-u*u'/h)*H*(I-u*u')/h)

          for (int j = m; j < n; j++) {
            Real f = 0.0;
            for (int i = high; i >= m; i--) {
              f += ort(i) * H(i, j);
            }
            f = f / h;
            for (int i = m; i <= high; i++) {
              H(i, j) -= f * ort(i);
            }
          }

          for (int i = 0; i <= high; i++) {
            Real f = 0.0;
            for (int j = high; j >= m; j--) {
              f += ort(j) * H(i, j);
            }
            f = f / h;
            for (int j = m; j <= high; j++) {
              H(i, j) -= f * ort(j);
            }
          }
          ort(m)      = scale * ort(m);
          H(m, m - 1) = scale * g;
        }
      }

      // Accumulate transformations (Algol's ortran).

      for (int i = 0; i < n; i++) {
        for (int j = 0; j < n; j++) {
          V(i, j) = (i == j ? 1.0 : 0.0);
        }
      }

      for (int m = high - 1; m >= low + 1; m--) {
        if (H(m, m - 1) != 0.0) {
          for (int i = m + 1; i <= high; i++) {
            ort(i) = H(i, m - 1);
          }
          for (int j = m; j <= high; j++) {
            Real g = 0.0;
            for (int i = m; i <= high; i++) {
              g += ort(i) * V(i, j);
            }
            // Double division avoids possible underflow
            g = (g / ort(m)) / H(m, m - 1);
            for (int i = m; i <= high; i++) {
              V(i, j) += g * ort(i);
            }
          }
        }
      }
    }